

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attacks.h
# Opt level: O0

Bitboard __thiscall
libchess::Position::attackers_to(Position *this,Square square,Bitboard occupancy)

{
  Bitboard rhs;
  Bitboard rhs_00;
  Bitboard occupancies;
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  Bitboard BVar4;
  undefined4 in_ESI;
  Position *in_RDI;
  PieceType pt;
  Bitboard attackers;
  Color in_stack_ffffffffffffff48;
  Square in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  PieceType PVar5;
  Position *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  Bitboard local_80;
  PieceType local_74;
  undefined4 local_70;
  undefined4 local_6c;
  value_type local_68;
  undefined4 uVar6;
  undefined4 uVar7;
  Bitboard local_50;
  undefined4 local_48;
  undefined4 local_44;
  value_type local_40;
  undefined4 local_38;
  undefined4 local_34;
  value_type local_30;
  Bitboard local_28 [3];
  undefined4 local_c;
  Bitboard local_8;
  
  local_c = in_ESI;
  Bitboard::Bitboard(&local_8);
  local_34 = local_c;
  local_38 = 0;
  local_30 = (value_type)lookups::pawn_attacks(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
  local_44 = 0;
  local_48 = 1;
  local_40 = (value_type)
             piece_type_bb(in_stack_ffffffffffffff60,
                           (MetaValueType<int>)
                           (value_type)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                           (MetaValueType<int>)(value_type)in_stack_ffffffffffffff68);
  BVar4.value_._4_4_ = in_stack_ffffffffffffff5c;
  BVar4.value_._0_4_ = in_stack_ffffffffffffff58;
  local_28[0] = Bitboard::operator&(in_RDI->piece_type_bb_,BVar4);
  vVar3 = Bitboard::operator_cast_to_unsigned_long(local_28);
  Bitboard::operator|=(&local_8,vVar3);
  uVar6 = 1;
  BVar4 = lookups::pawn_attacks(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
  local_6c = 0;
  local_70 = 0;
  local_68 = (value_type)
             piece_type_bb(in_stack_ffffffffffffff60,
                           (MetaValueType<int>)
                           (value_type)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                           (MetaValueType<int>)(value_type)in_stack_ffffffffffffff68);
  rhs.value_._4_4_ = in_stack_ffffffffffffff5c;
  rhs.value_._0_4_ = in_stack_ffffffffffffff58;
  local_50 = Bitboard::operator&(in_RDI->piece_type_bb_,rhs);
  vVar3 = Bitboard::operator_cast_to_unsigned_long(&local_50);
  Bitboard::operator|=(&local_8,vVar3);
  local_74.super_MetaValueType<int>.value_ = (MetaValueType<int>)1;
  uVar7 = local_c;
  while( true ) {
    vVar1 = MetaValueType::operator_cast_to_int((MetaValueType *)&local_74);
    vVar2 = MetaValueType::operator_cast_to_int((MetaValueType *)&constants::KING);
    if (vVar2 < vVar1) break;
    occupancies.value_._4_4_ = uVar7;
    occupancies.value_._0_4_ = uVar6;
    lookups::non_pawn_piece_type_attacks
              ((MetaValueType<int>)(value_type)(BVar4.value_ >> 0x20),
               (MetaValueType<int>)(value_type)BVar4.value_,occupancies);
    PVar5.super_MetaValueType<int>.value_ = local_74.super_MetaValueType<int>.value_;
    piece_type_bb(in_RDI,local_74);
    rhs_00.value_._4_4_ = PVar5.super_MetaValueType<int>.value_;
    rhs_00.value_._0_4_ = in_stack_ffffffffffffff58;
    local_80 = Bitboard::operator&(in_RDI->piece_type_bb_,rhs_00);
    vVar3 = Bitboard::operator_cast_to_unsigned_long(&local_80);
    Bitboard::operator|=(&local_8,vVar3);
    MetaValueType<int>::operator++((MetaValueType<int> *)in_RDI);
  }
  return (Bitboard)local_8.value_;
}

Assistant:

inline Bitboard Position::attackers_to(Square square, Bitboard occupancy) const {
    Bitboard attackers;
    attackers |= lookups::pawn_attacks(square, constants::WHITE) &
                 piece_type_bb(constants::PAWN, constants::BLACK);
    attackers |= lookups::pawn_attacks(square, constants::BLACK) &
                 piece_type_bb(constants::PAWN, constants::WHITE);
    for (PieceType pt = constants::KNIGHT; pt <= constants::KING; ++pt) {
        attackers |=
            lookups::non_pawn_piece_type_attacks(pt, square, occupancy) & piece_type_bb(pt);
    }
    return attackers;
}